

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

int tcmalloc::LgFloor(size_t n)

{
  int iVar1;
  ulong uVar2;
  size_t x;
  int shift;
  int i;
  int log;
  size_t n_local;
  
  log = 0;
  n_local = n;
  for (i = 4; -1 < i; i = i + -1) {
    iVar1 = 1 << ((byte)i & 0x1f);
    uVar2 = n_local >> ((byte)iVar1 & 0x3f);
    if (uVar2 != 0) {
      log = iVar1 + log;
      n_local = uVar2;
    }
  }
  return log;
}

Assistant:

static inline int LgFloor(size_t n) {
  int log = 0;
  for (int i = 4; i >= 0; --i) {
    int shift = (1 << i);
    size_t x = n >> shift;
    if (x != 0) {
      n = x;
      log += shift;
    }
  }
  ASSERT(n == 1);
  return log;
}